

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O0

btScalar gResolveSingleConstraintRowGeneric_scalar_reference
                   (btSolverBody *body1,btSolverBody *body2,btSolverConstraint *c)

{
  float fVar1;
  float fVar2;
  btVector3 *pbVar3;
  btVector3 *in_RDX;
  btSolverBody *in_RSI;
  btSolverBody *in_RDI;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  btScalar bVar7;
  float fVar8;
  btVector3 bVar9;
  btVector3 bVar10;
  btScalar sum;
  btScalar deltaVel2Dotn;
  btScalar deltaVel1Dotn;
  btScalar deltaImpulse;
  btVector3 *in_stack_ffffffffffffff78;
  btVector3 *in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined1 auVar11 [12];
  float local_1c;
  
  auVar11 = in_stack_ffffffffffffffb8._4_12_;
  fVar8 = in_RDX[7].m_floats[0];
  fVar1 = in_RDX[6].m_floats[1];
  fVar2 = in_RDX[7].m_floats[1];
  pbVar3 = btSolverBody::internalGetDeltaLinearVelocity(in_RDI);
  bVar4 = btVector3::dot(in_RDX + 1,pbVar3);
  pbVar3 = btSolverBody::internalGetDeltaAngularVelocity(in_RDI);
  bVar5 = btVector3::dot(in_RDX,pbVar3);
  pbVar3 = btSolverBody::internalGetDeltaLinearVelocity(in_RSI);
  bVar6 = btVector3::dot(in_RDX + 3,pbVar3);
  pbVar3 = btSolverBody::internalGetDeltaAngularVelocity(in_RSI);
  bVar7 = btVector3::dot(in_RDX + 2,pbVar3);
  local_1c = -(bVar6 + bVar7) * in_RDX[6].m_floats[3] +
             -(bVar4 + bVar5) * in_RDX[6].m_floats[3] + -fVar1 * fVar2 + fVar8;
  fVar8 = in_RDX[6].m_floats[1] + local_1c;
  if (in_RDX[7].m_floats[2] <= fVar8) {
    if (fVar8 < in_RDX[7].m_floats[3] || fVar8 == in_RDX[7].m_floats[3]) {
      in_RDX[6].m_floats[1] = fVar8;
    }
    else {
      local_1c = in_RDX[7].m_floats[3] - in_RDX[6].m_floats[1];
      in_RDX[6].m_floats[1] = in_RDX[7].m_floats[3];
    }
  }
  else {
    local_1c = in_RDX[7].m_floats[2] - in_RDX[6].m_floats[1];
    in_RDX[6].m_floats[1] = in_RDX[7].m_floats[2];
  }
  btSolverBody::internalGetInvMass(in_RDI);
  bVar9 = operator*(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  btSolverBody::internalApplyImpulse
            (bVar9.m_floats._8_8_,bVar9.m_floats._0_8_,auVar11._4_8_,auVar11._0_4_);
  pbVar3 = in_RDX + 3;
  btSolverBody::internalGetInvMass(in_RSI);
  bVar10 = operator*((btVector3 *)in_RSI,pbVar3);
  btSolverBody::internalApplyImpulse
            (bVar9.m_floats._8_8_,bVar9.m_floats._0_8_,bVar10.m_floats._8_8_,bVar10.m_floats[1]);
  return local_1c;
}

Assistant:

static btSimdScalar gResolveSingleConstraintRowGeneric_scalar_reference(btSolverBody& body1, btSolverBody& body2, const btSolverConstraint& c)
{
	btScalar deltaImpulse = c.m_rhs - btScalar(c.m_appliedImpulse)*c.m_cfm;
	const btScalar deltaVel1Dotn = c.m_contactNormal1.dot(body1.internalGetDeltaLinearVelocity()) + c.m_relpos1CrossNormal.dot(body1.internalGetDeltaAngularVelocity());
	const btScalar deltaVel2Dotn = c.m_contactNormal2.dot(body2.internalGetDeltaLinearVelocity()) + c.m_relpos2CrossNormal.dot(body2.internalGetDeltaAngularVelocity());

	//	const btScalar delta_rel_vel	=	deltaVel1Dotn-deltaVel2Dotn;
	deltaImpulse -= deltaVel1Dotn*c.m_jacDiagABInv;
	deltaImpulse -= deltaVel2Dotn*c.m_jacDiagABInv;

	const btScalar sum = btScalar(c.m_appliedImpulse) + deltaImpulse;
	if (sum < c.m_lowerLimit)
	{
		deltaImpulse = c.m_lowerLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_lowerLimit;
	}
	else if (sum > c.m_upperLimit)
	{
		deltaImpulse = c.m_upperLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_upperLimit;
	}
	else
	{
		c.m_appliedImpulse = sum;
	}

	body1.internalApplyImpulse(c.m_contactNormal1*body1.internalGetInvMass(), c.m_angularComponentA, deltaImpulse);
	body2.internalApplyImpulse(c.m_contactNormal2*body2.internalGetInvMass(), c.m_angularComponentB, deltaImpulse);

	return deltaImpulse;
}